

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

Vec_Ptr_t * Ver_ParseCollectUndefBoxes(Ver_Man_t *pMan)

{
  uint uVar1;
  void *pvVar2;
  uint *puVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  undefined8 *puVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  
  pVVar7 = pMan->pDesign->vModules;
  lVar4 = (long)pVVar7->nSize;
  if (0 < lVar4) {
    ppvVar6 = pVVar7->pArray;
    lVar11 = 0;
    do {
      *(undefined8 *)((long)ppvVar6[lVar11] + 0x158) = 0;
      lVar11 = lVar11 + 1;
    } while (lVar4 != lVar11);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(0x80);
  pVVar5->pArray = ppvVar6;
  pVVar7 = pMan->pDesign->vModules;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar4];
      lVar11 = *(long *)((long)pvVar2 + 0x50);
      if (0 < *(int *)(lVar11 + 4)) {
        lVar12 = 0;
        do {
          lVar11 = *(long *)(*(long *)(lVar11 + 8) + lVar12 * 8);
          if (((*(uint *)(lVar11 + 0x14) & 0xf) == 10) &&
             (pvVar10 = *(void **)(lVar11 + 0x38), pvVar10 != (void *)0x0)) {
            if (*(long *)((long)pvVar10 + 8) == 0) {
              __assert_fail("pNtkBox->pName",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                            ,0x4d,"int Ver_NtkIsDefined(Abc_Ntk_t *)");
            }
            if ((*(int *)(*(long *)((long)pvVar10 + 0x28) + 4) == 0) &&
               (*(int *)(*(long *)((long)pvVar10 + 0x30) + 4) == 0)) {
              if (*(long *)((long)pvVar10 + 0x158) == 0) {
                uVar1 = pVVar5->nSize;
                uVar14 = pVVar5->nCap;
                if (uVar1 == uVar14) {
                  if ((int)uVar14 < 0x10) {
                    if (pVVar5->pArray == (void **)0x0) {
                      ppvVar6 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
                    }
                    iVar13 = 0x10;
                  }
                  else {
                    iVar13 = uVar14 * 2;
                    if (iVar13 <= (int)uVar14) goto LAB_002ec176;
                    if (pVVar5->pArray == (void **)0x0) {
                      ppvVar6 = (void **)malloc((ulong)uVar14 << 4);
                    }
                    else {
                      ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar14 << 4);
                    }
                  }
                  pVVar5->pArray = ppvVar6;
                  pVVar5->nCap = iVar13;
                }
LAB_002ec176:
                pVVar5->nSize = uVar1 + 1;
                pVVar5->pArray[(int)uVar1] = pvVar10;
                puVar8 = (undefined8 *)malloc(0x10);
                *puVar8 = 0x10;
                pvVar9 = malloc(0x80);
                puVar8[1] = pvVar9;
                *(undefined8 **)((long)pvVar10 + 0x158) = puVar8;
              }
              puVar3 = *(uint **)((long)pvVar10 + 0x158);
              uVar1 = *puVar3;
              if (puVar3[1] == uVar1) {
                if ((int)uVar1 < 0x10) {
                  if (*(void **)(puVar3 + 2) == (void *)0x0) {
                    pvVar10 = malloc(0x80);
                  }
                  else {
                    pvVar10 = realloc(*(void **)(puVar3 + 2),0x80);
                  }
                  *(void **)(puVar3 + 2) = pvVar10;
                  uVar14 = 0x10;
                }
                else {
                  uVar14 = uVar1 * 2;
                  if ((int)uVar14 <= (int)uVar1) goto LAB_002ec222;
                  if (*(void **)(puVar3 + 2) == (void *)0x0) {
                    pvVar10 = malloc((ulong)uVar1 << 4);
                  }
                  else {
                    pvVar10 = realloc(*(void **)(puVar3 + 2),(ulong)uVar1 << 4);
                  }
                  *(void **)(puVar3 + 2) = pvVar10;
                }
                *puVar3 = uVar14;
              }
LAB_002ec222:
              uVar1 = puVar3[1];
              puVar3[1] = uVar1 + 1;
              *(long *)(*(long *)(puVar3 + 2) + (long)(int)uVar1 * 8) = lVar11;
            }
          }
          lVar12 = lVar12 + 1;
          lVar11 = *(long *)((long)pvVar2 + 0x50);
        } while (lVar12 < *(int *)(lVar11 + 4));
      }
      lVar4 = lVar4 + 1;
      pVVar7 = pMan->pDesign->vModules;
    } while (lVar4 < pVVar7->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Ver_ParseCollectUndefBoxes( Ver_Man_t * pMan )
{
    Vec_Ptr_t * vUndefs;
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pBox;
    int i, k;
    // clear the module structures
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->pData = NULL;
    // go through all the blackboxes
    vUndefs = Vec_PtrAlloc( 16 );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        Abc_NtkForEachBlackbox( pNtk, pBox, k )
        {
            pNtkBox = (Abc_Ntk_t *)pBox->pData;
            if ( pNtkBox == NULL )
                continue;
            if ( Ver_NtkIsDefined(pNtkBox) )
                continue;
            if ( pNtkBox->pData == NULL )
            {
                // save the box
                Vec_PtrPush( vUndefs, pNtkBox );
                pNtkBox->pData = Vec_PtrAlloc( 16 );
            }
            // save the instance
            Vec_PtrPush( (Vec_Ptr_t *)pNtkBox->pData, pBox );
        }
    }
    return vUndefs;
}